

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O1

void __thiscall dg::vr::Bucket::disconnect(Bucket *this)

{
  Type TVar1;
  pointer prVar2;
  Bucket *pBVar3;
  pointer prVar4;
  uint uVar5;
  pointer prVar6;
  long lVar7;
  ulong uVar8;
  
  lVar7 = 0;
  do {
    TVar1 = *(Type *)((long)&Relations::all + lVar7);
    uVar8 = (ulong)TVar1;
    if ((uVar8 == 0) &&
       (prVar2 = (this->relatedBuckets)._M_elems[0].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (this->relatedBuckets)._M_elems[0].vec.
       super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != prVar2)) {
      (this->relatedBuckets)._M_elems[0].vec.
      super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = prVar2;
    }
    prVar2 = (this->relatedBuckets)._M_elems[uVar8].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    prVar6 = (this->relatedBuckets)._M_elems[uVar8].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (prVar2 != prVar6) {
      pBVar3 = prVar2->_M_data;
      if (this->id != pBVar3->id) {
        uVar5 = dg::vr::Relations::inverted(TVar1);
        VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>
                  ((VectorSet<std::reference_wrapper<dg::vr::Bucket>> *)
                   ((pBVar3->relatedBuckets)._M_elems + uVar5),this);
      }
      prVar6 = prVar2 + 1;
      prVar4 = (this->relatedBuckets)._M_elems[uVar8].vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (prVar6 != prVar4) {
        memmove(prVar2,prVar6,(long)prVar4 - (long)prVar6);
      }
      prVar6 = (this->relatedBuckets)._M_elems[uVar8].vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->relatedBuckets)._M_elems[uVar8].vec.
      super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = prVar6;
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x30);
  return;
}

Assistant:

void disconnect() {
        for (Relations::Type type : Relations::all) {
            if (type == Relations::EQ) {
                assert(relatedBuckets[type].size() == 1);
                relatedBuckets[type].clear();
            }
            for (auto it = relatedBuckets[type].begin();
                 it != relatedBuckets[type].end();
                 /*incremented by erase*/) {
                if (*this != *it)
                    it->get().relatedBuckets[Relations::inverted(type)].erase(
                            *this);
                it = relatedBuckets[type].erase(it);
            }
        }
        assert(!hasAnyRelation());
    }